

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktQueryPoolOcclusionTests.cpp
# Opt level: O0

void __thiscall
vkt::QueryPool::anon_unknown_0::OcclusionQueryTestInstance::captureResults
          (OcclusionQueryTestInstance *this,deUint64 *retResults,deUint64 *retAvailAbility,
          bool allowNotReady)

{
  pointer puVar1;
  VkDevice device_00;
  size_type sVar2;
  reference pvVar3;
  TestError *pTVar4;
  Buffer *this_00;
  void *src;
  VkDeviceMemory memory;
  VkDeviceSize VVar5;
  deUint64 *pdVar6;
  deUint64 *srcPtrTyped_1;
  deUint32 *srcPtrTyped;
  void *srcPtr;
  int queryNdx;
  void *allocationData;
  Allocation *local_80;
  Allocation *allocation;
  VkResult local_70;
  VkResult queryResult;
  allocator<unsigned_char> local_59;
  undefined1 local_58 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> resultsBuffer;
  DeviceInterface *vk;
  VkDevice device;
  bool allowNotReady_local;
  deUint64 *retAvailAbility_local;
  deUint64 *retResults_local;
  OcclusionQueryTestInstance *this_local;
  
  device_00 = Context::getDevice((this->super_TestInstance).m_context);
  resultsBuffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)Context::getDeviceInterface((this->super_TestInstance).m_context);
  VVar5 = (this->m_testVector).queryResultsStride;
  std::allocator<unsigned_char>::allocator(&local_59);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_58,VVar5 * 3,&local_59);
  std::allocator<unsigned_char>::~allocator(&local_59);
  puVar1 = resultsBuffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  if ((this->m_testVector).queryResultsMode == RESULTS_MODE_GET) {
    allocation = (Allocation *)(this->m_queryPool).m_internal;
    sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_58);
    pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_58,0);
    local_70 = (**(code **)(*(long *)puVar1 + 0x100))
                         (puVar1,device_00,allocation,0,3,sVar2,pvVar3,
                          (this->m_testVector).queryResultsStride,this->m_queryResultFlags);
    if ((local_70 == VK_NOT_READY) && (!allowNotReady)) {
      pTVar4 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar4,
                 "getQueryPoolResults returned VK_NOT_READY, but results should be already available."
                 ,(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/query_pool/vktQueryPoolOcclusionTests.cpp"
                 ,0x373);
      __cxa_throw(pTVar4,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    ::vk::checkResult(local_70,"queryResult",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/query_pool/vktQueryPoolOcclusionTests.cpp"
                      ,0x377);
  }
  else if ((this->m_testVector).queryResultsMode == RESULTS_MODE_COPY) {
    this_00 = de::SharedPtr<vkt::Draw::Buffer>::operator->(&this->m_queryPoolResultsBuffer);
    Draw::Buffer::getBoundMemory((Allocation *)&allocationData,this_00);
    local_80 = (Allocation *)&allocationData;
    src = ::vk::Allocation::getHostPtr((Allocation *)&allocationData);
    puVar1 = resultsBuffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
             .super__Vector_impl_data._M_end_of_storage;
    memory = ::vk::Allocation::getMemory(local_80);
    VVar5 = ::vk::Allocation::getOffset(local_80);
    sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_58);
    ::vk::invalidateMappedMemoryRange((DeviceInterface *)puVar1,device_00,memory,VVar5,sVar2);
    pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_58,0);
    sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_58);
    ::deMemcpy(pvVar3,src,sVar2);
    ::vk::Allocation::~Allocation((Allocation *)&allocationData);
  }
  srcPtr._4_4_ = 0;
  do {
    if (2 < srcPtr._4_4_) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_58);
      return;
    }
    pdVar6 = (deUint64 *)
             std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_58,
                        (long)srcPtr._4_4_ * (this->m_testVector).queryResultsStride);
    if ((this->m_testVector).queryResultSize == RESULT_SIZE_32_BIT) {
      retResults[srcPtr._4_4_] = (ulong)(uint)*pdVar6;
      if (((this->m_testVector).queryResultsAvailability & 1U) != 0) {
        retAvailAbility[srcPtr._4_4_] = (ulong)*(uint *)((long)pdVar6 + 4);
      }
    }
    else {
      if ((this->m_testVector).queryResultSize != RESULT_SIZE_64_BIT) {
        pTVar4 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar4,"Wrong m_testVector.queryResultSize",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/query_pool/vktQueryPoolOcclusionTests.cpp"
                   ,0x39f);
        __cxa_throw(pTVar4,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
      retResults[srcPtr._4_4_] = *pdVar6;
      if ((((this->m_testVector).queryResultsAvailability & 1U) != 0) &&
         (((this->m_testVector).queryResultsAvailability & 1U) != 0)) {
        retAvailAbility[srcPtr._4_4_] = pdVar6[1];
      }
    }
    srcPtr._4_4_ = srcPtr._4_4_ + 1;
  } while( true );
}

Assistant:

void OcclusionQueryTestInstance::captureResults (deUint64* retResults, deUint64* retAvailAbility, bool allowNotReady)
{

	const vk::VkDevice			device			= m_context.getDevice();
	const vk::DeviceInterface&	vk				= m_context.getDeviceInterface();
	std::vector<deUint8>		resultsBuffer	(static_cast<size_t>(m_testVector.queryResultsStride) * NUM_QUERIES_IN_POOL);

	if (m_testVector.queryResultsMode == RESULTS_MODE_GET)
	{
		const vk::VkResult queryResult = vk.getQueryPoolResults(device, m_queryPool, 0, NUM_QUERIES_IN_POOL, resultsBuffer.size(), &resultsBuffer[0], m_testVector.queryResultsStride, m_queryResultFlags);
		if (queryResult == vk::VK_NOT_READY && !allowNotReady)
		{
			TCU_FAIL("getQueryPoolResults returned VK_NOT_READY, but results should be already available.");
		}
		else
		{
			VK_CHECK(queryResult);
		}
	}
	else if (m_testVector.queryResultsMode == RESULTS_MODE_COPY)
	{
		const vk::Allocation& allocation = m_queryPoolResultsBuffer->getBoundMemory();
		const void* allocationData = allocation.getHostPtr();

		vk::invalidateMappedMemoryRange(vk, device, allocation.getMemory(), allocation.getOffset(), resultsBuffer.size());

		deMemcpy(&resultsBuffer[0], allocationData, resultsBuffer.size());
	}

	for (int queryNdx = 0; queryNdx < NUM_QUERIES_IN_POOL; queryNdx++)
	{
		const void* srcPtr = &resultsBuffer[queryNdx * static_cast<size_t>(m_testVector.queryResultsStride)];
		if (m_testVector.queryResultSize == RESULT_SIZE_32_BIT)
		{
			const deUint32* srcPtrTyped = static_cast<const deUint32*>(srcPtr);
			retResults[queryNdx]		= *srcPtrTyped;
			if (m_testVector.queryResultsAvailability)
			{
				retAvailAbility[queryNdx] = *(srcPtrTyped + 1);
			}
		}
		else if (m_testVector.queryResultSize == RESULT_SIZE_64_BIT)
		{
			const deUint64* srcPtrTyped = static_cast<const deUint64*>(srcPtr);
			retResults[queryNdx]		= *srcPtrTyped;

			if (m_testVector.queryResultsAvailability)
			{
				if (m_testVector.queryResultsAvailability)
				{
					retAvailAbility[queryNdx] = *(srcPtrTyped + 1);
				}
			}
		}
		else
		{
			TCU_FAIL("Wrong m_testVector.queryResultSize");
		}
	}
}